

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::format
          (RuleBasedNumberFormat *this,DecimalQuantity *number,UnicodeString *appendTo,
          FieldPositionIterator *posIter,UErrorCode *status)

{
  RuleBasedNumberFormat *pRVar1;
  UBool UVar2;
  bool bVar3;
  int64_t iVar4;
  NumberFormat *pNVar5;
  DecimalQuantity *pDVar6;
  double dVar7;
  DecimalQuantity *local_178;
  LocalPointerBase<icu_63::number::impl::DecimalQuantity> local_120;
  LocalPointer<icu_63::number::impl::DecimalQuantity> decimalQuantity;
  Formattable f;
  LocalPointerBase<icu_63::NumberFormat> local_a0;
  LocalPointer<icu_63::NumberFormat> decimalFormat;
  undefined1 local_88 [8];
  DecimalQuantity copy;
  UErrorCode *status_local;
  FieldPositionIterator *posIter_local;
  UnicodeString *appendTo_local;
  DecimalQuantity *number_local;
  RuleBasedNumberFormat *this_local;
  
  copy._72_8_ = status;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 != '\0') {
    return appendTo;
  }
  icu_63::number::impl::DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_88,number);
  bVar3 = icu_63::number::impl::DecimalQuantity::fitsInLong((DecimalQuantity *)local_88,false);
  if (bVar3) {
    iVar4 = icu_63::number::impl::DecimalQuantity::toLong(number,false);
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x10])
              (this,iVar4,appendTo,posIter,copy._72_8_);
  }
  else {
    icu_63::number::impl::DecimalQuantity::roundToMagnitude
              ((DecimalQuantity *)local_88,0,UNUM_FOUND_HALFEVEN,(UErrorCode *)copy._72_8_);
    bVar3 = icu_63::number::impl::DecimalQuantity::fitsInLong((DecimalQuantity *)local_88,false);
    if (bVar3) {
      dVar7 = icu_63::number::impl::DecimalQuantity::toDouble(number);
      (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[10])
                (dVar7,this,appendTo,posIter,copy._72_8_);
    }
    else {
      pNVar5 = NumberFormat::createInstance(&this->locale,UNUM_DECIMAL,(UErrorCode *)copy._72_8_);
      LocalPointer<icu_63::NumberFormat>::LocalPointer
                ((LocalPointer<icu_63::NumberFormat> *)&local_a0,pNVar5,(UErrorCode *)copy._72_8_);
      UVar2 = LocalPointerBase<icu_63::NumberFormat>::isNull(&local_a0);
      if (UVar2 == '\0') {
        Formattable::Formattable((Formattable *)&decimalQuantity);
        pDVar6 = (DecimalQuantity *)UMemory::operator_new((UMemory *)0x50,(size_t)pNVar5);
        local_178 = (DecimalQuantity *)0x0;
        if (pDVar6 != (DecimalQuantity *)0x0) {
          icu_63::number::impl::DecimalQuantity::DecimalQuantity(pDVar6,number);
          local_178 = pDVar6;
        }
        LocalPointer<icu_63::number::impl::DecimalQuantity>::LocalPointer
                  ((LocalPointer<icu_63::number::impl::DecimalQuantity> *)&local_120,local_178,
                   (UErrorCode *)copy._72_8_);
        UVar2 = LocalPointerBase<icu_63::number::impl::DecimalQuantity>::isNull(&local_120);
        pRVar1 = (RuleBasedNumberFormat *)appendTo;
        if (UVar2 == '\0') {
          pDVar6 = LocalPointerBase<icu_63::number::impl::DecimalQuantity>::orphan(&local_120);
          Formattable::adoptDecimalQuantity((Formattable *)&decimalQuantity,pDVar6);
          pNVar5 = LocalPointerBase<icu_63::NumberFormat>::operator->(&local_a0);
          (*(pNVar5->super_Format).super_UObject._vptr_UObject[6])
                    (pNVar5,&decimalQuantity,appendTo,posIter,copy._72_8_);
          pRVar1 = this_local;
        }
        this_local = pRVar1;
        bVar3 = UVar2 != '\0';
        LocalPointer<icu_63::number::impl::DecimalQuantity>::~LocalPointer
                  ((LocalPointer<icu_63::number::impl::DecimalQuantity> *)&local_120);
        Formattable::~Formattable((Formattable *)&decimalQuantity);
      }
      else {
        bVar3 = true;
        this_local = (RuleBasedNumberFormat *)appendTo;
      }
      LocalPointer<icu_63::NumberFormat>::~LocalPointer
                ((LocalPointer<icu_63::NumberFormat> *)&local_a0);
      if (bVar3) goto LAB_002712dd;
    }
  }
  this_local = (RuleBasedNumberFormat *)appendTo;
LAB_002712dd:
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_88);
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
RuleBasedNumberFormat::format(const DecimalQuantity &number,
                      UnicodeString &appendTo,
                      FieldPositionIterator *posIter,
                      UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return appendTo;
    }
    DecimalQuantity copy(number);
    if (copy.fitsInLong()) {
        format(number.toLong(), appendTo, posIter, status);
    }
    else {
        copy.roundToMagnitude(0, number::impl::RoundingMode::UNUM_ROUND_HALFEVEN, status);
        if (copy.fitsInLong()) {
            format(number.toDouble(), appendTo, posIter, status);
        }
        else {
            // We're outside of our normal range that this framework can handle.
            // The DecimalFormat will provide more accurate results.

            // TODO this section should probably be optimized. The DecimalFormat is shared in ICU4J.
            LocalPointer<NumberFormat> decimalFormat(NumberFormat::createInstance(locale, UNUM_DECIMAL, status), status);
            if (decimalFormat.isNull()) {
                return appendTo;
            }
            Formattable f;
            LocalPointer<DecimalQuantity> decimalQuantity(new DecimalQuantity(number), status);
            if (decimalQuantity.isNull()) {
                return appendTo;
            }
            f.adoptDecimalQuantity(decimalQuantity.orphan()); // f now owns decimalQuantity.
            decimalFormat->format(f, appendTo, posIter, status);
        }
    }
    return appendTo;
}